

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

bool __thiscall
ADSBExchangeConnection::ProcessErrors(ADSBExchangeConnection *this,JSON_Object *pObj)

{
  bool bVar1;
  char *__s;
  bool bVar2;
  allocator<char> local_41;
  string errTxt;
  
  __s = jog_s(pObj,"message");
  std::__cxx11::string::string<std::allocator<char>>((string *)&errTxt,__s,&local_41);
  if (errTxt._M_string_length == 0) {
    jog_s(pObj,"msg");
    std::__cxx11::string::assign((char *)&errTxt);
    if (errTxt._M_string_length == 0) {
      bVar2 = true;
      goto LAB_0013cae0;
    }
  }
  bVar1 = std::operator!=(&errTxt,"No error");
  bVar2 = true;
  if (bVar1) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x1d7,"ProcessErrors",logERR,"ADS-B Exchange: Received an ERRor response: %s",
             errTxt._M_dataplus._M_p);
    }
    (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
      _vptr_LTChannel[8])(this);
    bVar2 = false;
  }
LAB_0013cae0:
  std::__cxx11::string::~string((string *)&errTxt);
  return bVar2;
}

Assistant:

bool ADSBExchangeConnection::ProcessErrors (const JSON_Object* pObj)
{
    // test for non-OK response in 'message' / 'msg'
    std::string errTxt = jog_s(pObj, ADSBEX_MESSAGE);
    if (errTxt.empty())
        errTxt = jog_s(pObj, ADSBEX_MSG);    
    if (!errTxt.empty() && errTxt != ADSBEX_SUCCESS)
    {
        LOG_MSG(logERR, ERR_ADSBEX_OTHER, errTxt.c_str());
        IncErrCnt();
        return false;
    }
    
    // Looks OK
    return true;
}